

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

void compactor_init(compactor_config *config)

{
  size_t __nmemb;
  ulong uVar1;
  long lVar2;
  bool bVar3;
  
  if (compactor_initialized != '\0') {
    return;
  }
  pthread_mutex_init((pthread_mutex_t *)&cpt_lock,(pthread_mutexattr_t *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  if (compactor_initialized == '\0') {
    compactor_args.strcmp_len = 0x400;
    avl_init(&openfiles,&compactor_args);
    if ((config != (compactor_config *)0x0) && (config->sleep_duration != 0)) {
      sleep_duration = config->sleep_duration;
    }
    LOCK();
    compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i =
         (__atomic_base<unsigned_char>)'\0';
    UNLOCK();
    pthread_mutex_init((pthread_mutex_t *)&sync_mutex,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&sync_cond,(pthread_condattr_t *)0x0);
    __nmemb = config->num_threads;
    num_compactor_threads = __nmemb;
    compactor_tids = (pthread_t *)calloc(__nmemb,8);
    if ((__nmemb != 0) && (config->spawn_threads != false)) {
      lVar2 = 0;
      uVar1 = 1;
      do {
        pthread_create((pthread_t *)((long)compactor_tids + lVar2),(pthread_attr_t *)0x0,
                       compactor_thread,(void *)0x0);
        if (config->spawn_threads != true) break;
        lVar2 = lVar2 + 8;
        bVar3 = uVar1 < num_compactor_threads;
        uVar1 = uVar1 + 1;
      } while (bVar3);
    }
    compactor_initialized = '\x01';
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return;
}

Assistant:

void compactor_init(struct compactor_config *config)
{
    if (!compactor_initialized) {
        // Note that this function is synchronized by the spin lock in fdb_init API.
        mutex_init(&cpt_lock);

        mutex_lock(&cpt_lock);
        if (!compactor_initialized) {
            // initialize
            compactor_args.strcmp_len = MAX_FNAMELEN;
            avl_init(&openfiles, &compactor_args);

            if (config) {
                if (config->sleep_duration > 0) {
                    sleep_duration = config->sleep_duration;
                }
            }

            compactor_terminate_signal = 0;

            mutex_init(&sync_mutex);
            thread_cond_init(&sync_cond);

            // create worker threads
            num_compactor_threads = config->num_threads;
            compactor_tids = (thread_t *)calloc
                             ( num_compactor_threads, sizeof(thread_t) );
            for ( size_t i = 0;
                  config->spawn_threads && i < num_compactor_threads;
                  ++i ) {
                thread_create(&compactor_tids[i], compactor_thread, NULL);
            }

            compactor_initialized = 1;
        }
        mutex_unlock(&cpt_lock);
    }
}